

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

void glfwGetMonitorPos(GLFWmonitor *handle,int *xpos,int *ypos)

{
  undefined8 uVar1;
  long lVar2;
  _GLFWmonitor *monitor;
  
  if (xpos != (int *)0x0) {
    *xpos = 0;
  }
  if (ypos != (int *)0x0) {
    *ypos = 0;
  }
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if ((_glfw.x11.randr.available != '\0') && (_glfw.x11.randr.monitorBroken == '\0')) {
    uVar1 = XRRGetScreenResourcesCurrent(_glfw.x11.display,_glfw.x11.root);
    lVar2 = XRRGetCrtcInfo(_glfw.x11.display,uVar1,*(undefined8 *)(handle + 0x80));
    if (xpos != (int *)0x0) {
      *xpos = *(int *)(lVar2 + 8);
    }
    if (ypos != (int *)0x0) {
      *ypos = *(int *)(lVar2 + 0xc);
    }
    XRRFreeCrtcInfo(lVar2);
    XRRFreeScreenResources(uVar1);
    return;
  }
  return;
}

Assistant:

GLFWAPI void glfwGetMonitorPos(GLFWmonitor* handle, int* xpos, int* ypos)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;

    _GLFW_REQUIRE_INIT();

    _glfwPlatformGetMonitorPos(monitor, xpos, ypos);
}